

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_0::CWriter::WriteLocals
          (CWriter *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *index_to_name)

{
  int iVar1;
  Func *pFVar2;
  pointer pTVar3;
  pointer pTVar4;
  pointer u;
  Type TVar5;
  pointer pbVar6;
  Enum EVar7;
  size_t size;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  Type type;
  ulong uVar11;
  pointer ppVar12;
  char *__s;
  string_view name;
  string_view include_condition;
  string local_50;
  
  pFVar2 = this->func_;
  pTVar3 = (pFVar2->decl).sig.param_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar4 = (pFVar2->decl).sig.param_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = 0;
  do {
    type.type_index_ = 0;
    type.enum_ = *(uint *)((long)&DAT_001759cc + lVar9);
    if (type == (Type)0xffffffeb) {
      __assert_fail("!EnumIsReferenceWithIndex(enum_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/type.h"
                    ,0x43,"wabt::Type::Type(Enum)");
    }
    ppVar12 = (pFVar2->local_types).decls_.
              super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    u = (pFVar2->local_types).decls_.
        super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar12 != u) {
      uVar11 = 0;
      uVar8 = (ulong)((long)pTVar3 - (long)pTVar4) >> 3 & 0xffffffff;
      uVar10 = 0;
      do {
        TVar5 = ppVar12->first;
        if (TVar5 == type) {
          if (uVar11 == 0) {
            Write(this,type);
            WriteData(this," ",1);
            include_condition._M_str = "exceptions";
            include_condition._M_len = 10;
            PushFuncSection(this,include_condition);
            WriteData(this,"volatile ",9);
            PushFuncSection(this,(string_view)(ZEXT816(0x16fba4) << 0x40));
            this->indent_ = this->indent_ + 4;
          }
          else {
            WriteData(this,", ",2);
            if ((uVar11 & 7) == 0) {
              if (this->consecutive_newline_count_ < 2) {
                WriteData(this,"\n",1);
                this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
              }
              this->should_write_indent_next_ = true;
            }
          }
          pbVar6 = (index_to_name->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          name._M_str = pbVar6[uVar8]._M_dataplus._M_p;
          name._M_len = pbVar6[uVar8]._M_string_length;
          (anonymous_namespace)::CWriter::DefineLocalScopeName_abi_cxx11_
                    (&local_50,(CWriter *)this,name,false);
          WriteData(this,local_50._M_dataplus._M_p,local_50._M_string_length);
          WriteData(this," = ",3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          EVar7 = TVar5.enum_;
          __s = "wasm_rt_funcref_null_value";
          switch(EVar7) {
          case ExnRef:
            __s = "wasm_rt_exnref_null_value";
            break;
          default:
            if (EVar7 == V128) {
              size = 0x1b;
              __s = "simde_wasm_i64x2_make(0, 0)";
            }
            else {
              size = 1;
              __s = "0";
            }
            goto LAB_0014ad28;
          case Reference:
            abort();
          case ExternRef:
            __s = "wasm_rt_externref_null_value";
            break;
          case FuncRef:
            break;
          }
          size = strlen(__s);
LAB_0014ad28:
          WriteData(this,__s,size);
          uVar11 = uVar11 + 1;
        }
        uVar10 = uVar10 + 1;
        if (ppVar12->second <= uVar10) {
          uVar10 = 0;
          ppVar12 = ppVar12 + 1;
        }
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (uVar10 != 0 || ppVar12 != u);
      if (uVar11 != 0) {
        iVar1 = this->indent_;
        this->indent_ = iVar1 + -4;
        if (iVar1 < 4) {
          __assert_fail("indent_ >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                        ,0x41c,"void wabt::(anonymous namespace)::CWriter::Dedent(int)");
        }
        (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [2])0x171bb9,(Newline *)u);
      }
    }
    lVar9 = lVar9 + 4;
    if (lVar9 == 0x20) {
      return;
    }
  } while( true );
}

Assistant:

void CWriter::WriteLocals(const std::vector<std::string>& index_to_name) {
  Index num_params = func_->GetNumParams();
  WriteVarsByType(
      func_->local_types, [](auto x) { return x; },
      [&](Index local_index, Type local_type) {
        Write(DefineParamName(index_to_name[num_params + local_index]), " = ");
        if (local_type.IsRef()) {
          Write(GetReferenceNullValue(local_type));
        } else if (local_type == Type::V128) {
          Write("simde_wasm_i64x2_make(0, 0)");
        } else {
          Write("0");
        }
      },
      true);
}